

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_read_qcd_v2(opj_j2k_v2_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                        opj_event_mgr *p_manager)

{
  opj_tccp_t *poVar1;
  opj_bool oVar2;
  opj_tcp_v2_t *poVar3;
  opj_bool oVar4;
  OPJ_UINT32 *pOVar5;
  uint uVar6;
  OPJ_UINT32 local_34;
  
  oVar4 = 0;
  local_34 = p_header_size;
  oVar2 = j2k_read_SQcd_SQcc(p_j2k,0,p_header_data,&local_34,p_manager);
  if ((oVar2 == 0) || (local_34 != 0)) {
    opj_event_msg_v2(p_manager,1,"Error reading QCD marker\n");
  }
  else {
    if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
      poVar3 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
    }
    else {
      poVar3 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
    }
    oVar4 = 1;
    if (1 < p_j2k->m_private_image->numcomps) {
      poVar1 = poVar3->tccps;
      pOVar5 = &poVar1[1].qntsty;
      uVar6 = 1;
      do {
        *pOVar5 = poVar1->qntsty;
        pOVar5[0xc3] = poVar1->numgbits;
        memcpy((opj_stepsize_t *)(pOVar5 + 1),poVar1->stepsizes,0x308);
        uVar6 = uVar6 + 1;
        pOVar5 = pOVar5 + 0x10e;
      } while (uVar6 < p_j2k->m_private_image->numcomps);
    }
  }
  return oVar4;
}

Assistant:

opj_bool j2k_read_qcd_v2 (
				    opj_j2k_v2_t *p_j2k,
					OPJ_BYTE * p_header_data,
					OPJ_UINT32 p_header_size,
					struct opj_event_mgr * p_manager
					)
{
	/* preconditions */
	assert(p_header_data != 00);
	assert(p_j2k != 00);
	assert(p_manager != 00);

	if (! j2k_read_SQcd_SQcc(p_j2k,0,p_header_data,&p_header_size,p_manager)) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCD marker\n");
		return OPJ_FALSE;
	}

	if (p_header_size != 0) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "Error reading QCD marker\n");
		return OPJ_FALSE;
	}

	/* Apply the quantization parameters to other components of the current tile or the m_default_tcp */
	j2k_copy_tile_quantization_parameters(p_j2k);

	return OPJ_TRUE;
}